

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O2

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
utf8::append<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (uint32_t cp,
          back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> result)

{
  undefined8 *puVar1;
  byte bVar2;
  uchar *__args;
  uchar local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  uchar local_16;
  byte local_15;
  byte local_14;
  uchar local_13;
  byte local_12;
  uchar local_11;
  
  if ((cp < 0x110000) && ((cp & 0xfffff800) != 0xd800)) {
    if (cp < 0x80) {
      __args = &local_11;
    }
    else {
      bVar2 = (byte)cp;
      if (cp < 0x800) {
        local_12 = (byte)(cp >> 6) | 0xc0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (result.container,&local_12);
        cp = (uint32_t)(bVar2 & 0x3f | 0x80);
        __args = &local_13;
      }
      else if (cp < 0x10000) {
        local_14 = (byte)(cp >> 0xc) | 0xe0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (result.container,&local_14);
        local_15 = (byte)(cp >> 6) & 0x3f | 0x80;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (result.container,&local_15);
        cp = (uint32_t)(bVar2 & 0x3f | 0x80);
        __args = &local_16;
      }
      else {
        local_17 = (byte)(cp >> 0x12) | 0xf0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (result.container,&local_17);
        local_18 = (byte)(cp >> 0xc) & 0x3f | 0x80;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (result.container,&local_18);
        local_19 = (byte)(cp >> 6) & 0x3f | 0x80;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (result.container,&local_19);
        cp = (uint32_t)(bVar2 & 0x3f | 0x80);
        __args = &local_1a;
      }
    }
    *__args = (uchar)cp;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (result.container,__args);
    return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
           (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
           result.container;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_00244a88;
  *(uint32_t *)(puVar1 + 1) = cp;
  __cxa_throw(puVar1,&invalid_code_point::typeinfo,std::exception::~exception);
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }